

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O1

bool __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::lower_upper_bound_dimension
          (Simplex_tree<Gudhi::Simplex_tree_options_default> *this)

{
  Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
  *pSVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>
  local_30;
  
  this->dimension_to_be_lowered_ = false;
  if ((this->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_size == 0) {
    local_30.sib_ = (Siblings *)0x0;
    local_30.sh_.m_ptr =
         (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
          *)0x0;
    local_30.st_ = (Simplex_tree<Gudhi::Simplex_tree_options_default> *)0x0;
  }
  else {
    local_30.sh_.m_ptr =
         (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
          *)(this->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_start;
    local_30.st_ = this;
    if (((((pointer)local_30.sh_.m_ptr)->second).children_)->parent_ ==
        ((pointer)local_30.sh_.m_ptr)->first) {
      do {
        local_30.sib_ = (((pointer)local_30.sh_.m_ptr)->second).children_;
        local_30.sh_.m_ptr =
             (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
              *)((local_30.sib_)->members_).m_flat_tree.m_data.m_seq.m_holder.m_start;
      } while (((((pointer)local_30.sh_.m_ptr)->second).children_)->parent_ ==
               ((pointer)local_30.sh_.m_ptr)->first);
    }
    else {
      local_30.sib_ = &this->root_;
    }
  }
  bVar4 = local_30.st_ == (Simplex_tree<Gudhi::Simplex_tree_options_default> *)0x0;
  iVar3 = -1;
  if (!bVar4) {
    do {
      pSVar1 = ((local_30.sh_.m_ptr)->second).children_;
      if (pSVar1->parent_ == (local_30.sh_.m_ptr)->first) {
        pSVar1 = pSVar1->oncles_;
      }
      iVar2 = -1;
      for (; pSVar1 != (Siblings *)0x0; pSVar1 = pSVar1->oncles_) {
        iVar2 = iVar2 + 1;
      }
      if (this->dimension_ <= iVar2) {
        return bVar4;
      }
      if (iVar3 <= iVar2) {
        iVar3 = iVar2;
      }
      Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>
      ::increment(&local_30);
      bVar4 = local_30.st_ == (Simplex_tree<Gudhi::Simplex_tree_options_default> *)0x0;
    } while (!bVar4);
  }
  this->dimension_ = iVar3;
  return bVar4;
}

Assistant:

bool lower_upper_bound_dimension() const {
    // reset automatic detection to recompute
    dimension_to_be_lowered_ = false;
    int new_dimension = -1;
    // Browse the tree from the left to the right as higher dimension cells are more likely on the left part of the tree
    for (Simplex_handle sh : complex_simplex_range()) {
#ifdef DEBUG_TRACES
      for (auto vertex : simplex_vertex_range(sh)) {
        std::clog << " " << vertex;
      }
      std::clog << std::endl;
#endif  // DEBUG_TRACES

      int sh_dimension = dimension(sh);
      if (sh_dimension >= dimension_)
        // Stop browsing as soon as the dimension is reached, no need to go further
        return false;
      new_dimension = (std::max)(new_dimension, sh_dimension);
    }
    dimension_ = new_dimension;
    return true;
  }